

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O3

void __thiscall nv::AlphaBlockDXT5::evaluatePalette8(AlphaBlockDXT5 *this,uint8 *alpha)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar13 [16];
  
  uVar1 = (this->field_0).u;
  *alpha = (uint8)uVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1 & 0xffff | ((this->field_0).u >> 8 & 0xffff) << 0x10;
  auVar5 = auVar5 & _DAT_001f83b0;
  auVar13 = pshuflw(in_XMM1,auVar5,0x10);
  uVar2 = auVar5._2_2_;
  auVar6._0_2_ = uVar2 + auVar13._0_2_ * 6;
  auVar6._2_2_ = (short)((uint)uVar2 + (uint)uVar2) + auVar13._2_2_ * 5;
  auVar6._4_2_ = auVar5._0_2_ * 4 + auVar13._4_2_ * 3;
  auVar6._6_2_ = uVar2 * 4 + auVar13._6_2_ * 3;
  auVar6._8_2_ = auVar5._10_2_;
  auVar6._10_2_ = 0;
  auVar6._12_2_ = auVar5._14_2_;
  auVar6._14_2_ = 0;
  auVar13 = pmulhuw(_DAT_001f83d0,auVar6);
  uVar3 = (ushort)(((ushort)(auVar6._0_2_ - auVar13._0_2_) >> 1) + auVar13._0_2_) >> 2;
  uVar7 = (ushort)(((ushort)(auVar6._2_2_ - auVar13._2_2_) >> 1) + auVar13._2_2_) >> 2;
  uVar9 = (ushort)(((ushort)(auVar6._4_2_ - auVar13._4_2_) >> 1) + auVar13._4_2_) >> 2;
  uVar11 = (ushort)(((ushort)(auVar6._6_2_ - auVar13._6_2_) >> 1) + auVar13._6_2_) >> 2;
  uVar4 = uVar3 & 0xff;
  uVar8 = uVar7 & 0xff;
  uVar10 = uVar9 & 0xff;
  uVar12 = uVar11 & 0xff;
  alpha[1] = (uint8)((this->field_0).u >> 8);
  *(uint *)(alpha + 2) =
       CONCAT13((uVar12 != 0) * (uVar12 < 0x100) * (char)uVar11 - (0xff < uVar12),
                CONCAT12((uVar10 != 0) * (uVar10 < 0x100) * (char)uVar9 - (0xff < uVar10),
                         CONCAT11((uVar8 != 0) * (uVar8 < 0x100) * (char)uVar7 - (0xff < uVar8),
                                  (uVar4 != 0) * (uVar4 < 0x100) * (char)uVar3 - (0xff < uVar4))));
  alpha[6] = (uint8)(((uint)uVar2 + (uint)uVar2 * 4 + auVar5._0_4_ * 2 & 0xffff) * 0x2493 >> 0x10);
  alpha[7] = (uint8)((((uint)uVar2 + (uint)uVar2) * 3 + auVar5._0_4_ & 0xffff) * 0x2493 >> 0x10);
  return;
}

Assistant:

void AlphaBlockDXT5::evaluatePalette8(uint8 alpha[8]) const
{
	// 8-alpha block:  derive the other six alphas.
	// Bit code 000 = alpha0, 001 = alpha1, others are interpolated.
	alpha[0] = alpha0;
	alpha[1] = alpha1;
	alpha[2] = (6 * alpha[0] + 1 * alpha[1]) / 7;	// bit code 010
	alpha[3] = (5 * alpha[0] + 2 * alpha[1]) / 7;	// bit code 011
	alpha[4] = (4 * alpha[0] + 3 * alpha[1]) / 7;	// bit code 100
	alpha[5] = (3 * alpha[0] + 4 * alpha[1]) / 7;	// bit code 101
	alpha[6] = (2 * alpha[0] + 5 * alpha[1]) / 7;	// bit code 110
	alpha[7] = (1 * alpha[0] + 6 * alpha[1]) / 7;	// bit code 111
}